

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

bool __thiscall
cmMakefile::EnforceUniqueName(cmMakefile *this,string *name,string *msg,bool isCustom)

{
  pointer ppcVar1;
  cmake *pcVar2;
  cmState *this_00;
  bool bVar3;
  byte bVar4;
  PolicyStatus PVar5;
  TargetType TVar6;
  ostream *poVar7;
  cmTarget *this_01;
  cmMakefile *pcVar8;
  string *psVar9;
  PolicyID id;
  byte unaff_BPL;
  ostringstream e;
  string local_1e8;
  long *local_1c8 [2];
  long local_1b8 [2];
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  bVar3 = IsAlias(this,name);
  if (bVar3) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"cannot create target \"",0x16);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(name->_M_dataplus)._M_p,name->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"\" because an alias with the same name already exists.",0x35);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)msg,(string *)&local_1e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    bVar4 = 0;
    goto LAB_001b87ed;
  }
  this_01 = FindTargetToUse(this,name,false);
  if (this_01 != (cmTarget *)0x0) {
    bVar3 = cmTarget::IsImported(this_01);
    if (bVar3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"cannot create target \"",0x16);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(name->_M_dataplus)._M_p,name->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"\" because an imported target with the same name already exists.",0x3f);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)msg,(string *)&local_1e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      unaff_BPL = 0;
    }
    else {
      PVar5 = cmStateSnapshot::GetPolicy(&this->StateSnapshot,CMP0002,false);
      unaff_BPL = 1;
      if (PVar5 - REQUIRED_IF_USED < 2) {
        cmPolicies::GetRequiredPolicyError_abi_cxx11_
                  ((string *)local_1a8,(cmPolicies *)&DAT_00000002,id);
        ppcVar1 = (this->ExecutionStatusStack).
                  super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        if ((this->ExecutionStatusStack).
            super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>._M_impl.
            super__Vector_impl_data._M_start != ppcVar1) {
          ppcVar1[-1]->NestedError = true;
        }
        cmake::IssueMessage(this->GlobalGenerator->CMakeInstance,FATAL_ERROR,(string *)local_1a8,
                            &this->Backtrace);
LAB_001b85e0:
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
        }
      }
      else if (PVar5 != OLD) {
        if (PVar5 == WARN) {
          cmPolicies::GetPolicyWarning_abi_cxx11_
                    ((string *)local_1a8,(cmPolicies *)&DAT_00000002,id);
          cmake::IssueMessage(this->GlobalGenerator->CMakeInstance,AUTHOR_WARNING,
                              (string *)local_1a8,&this->Backtrace);
          goto LAB_001b85e0;
        }
        if (isCustom) {
          pcVar2 = this->GlobalGenerator->CMakeInstance;
          TVar6 = cmTarget::GetType(this_01);
          if ((TVar6 != UTILITY) || (pcVar8 = cmTarget::GetMakefile(this_01), pcVar8 == this))
          goto LAB_001b8666;
          this_00 = (pcVar2->State)._M_t.
                    super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                    super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                    super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
          local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1e8,"ALLOW_DUPLICATE_CUSTOM_TARGETS","");
          unaff_BPL = cmState::GetGlobalPropertyAsBool(this_00,&local_1e8);
          bVar3 = true;
        }
        else {
LAB_001b8666:
          bVar3 = false;
          unaff_BPL = false;
        }
        if ((bVar3) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2)) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
        if ((bool)unaff_BPL == false) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"cannot create target \"",0x16);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(name->_M_dataplus)._M_p,name->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,"\" because another target with the same name already exists.  ",0x3d);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"The existing target is ",0x17);
          TVar6 = cmTarget::GetType(this_01);
          if ((TVar6 < UNKNOWN_LIBRARY) && ((0xafU >> (TVar6 & 0x1f) & 1) != 0)) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       &DAT_0079a328 + *(int *)(&DAT_0079a328 + (ulong)TVar6 * 4),
                       *(long *)(&DAT_0079a348 + (ulong)TVar6 * 8));
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"created in source directory \"",0x1d);
          pcVar8 = cmTarget::GetMakefile(this_01);
          psVar9 = GetCurrentSourceDirectory_abi_cxx11_(pcVar8);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(psVar9->_M_dataplus)._M_p,
                              psVar9->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\".  ",4);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,"See documentation for policy CMP0002 for more details.",0x36);
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::operator=((string *)msg,(string *)local_1c8);
          if (local_1c8[0] != local_1b8) {
            operator_delete(local_1c8[0],local_1b8[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
        }
      }
    }
  }
  bVar4 = this_01 == (cmTarget *)0x0 | unaff_BPL;
LAB_001b87ed:
  return (bool)(bVar4 & 1);
}

Assistant:

bool cmMakefile::EnforceUniqueName(std::string const& name, std::string& msg,
                                   bool isCustom) const
{
  if (this->IsAlias(name)) {
    std::ostringstream e;
    e << "cannot create target \"" << name
      << "\" because an alias with the same name already exists.";
    msg = e.str();
    return false;
  }
  if (cmTarget* existing = this->FindTargetToUse(name)) {
    // The name given conflicts with an existing target.  Produce an
    // error in a compatible way.
    if (existing->IsImported()) {
      // Imported targets were not supported in previous versions.
      // This is new code, so we can make it an error.
      std::ostringstream e;
      e << "cannot create target \"" << name
        << "\" because an imported target with the same name already exists.";
      msg = e.str();
      return false;
    }
    // target names must be globally unique
    switch (this->GetPolicyStatus(cmPolicies::CMP0002)) {
      case cmPolicies::WARN:
        this->IssueMessage(MessageType::AUTHOR_WARNING,
                           cmPolicies::GetPolicyWarning(cmPolicies::CMP0002));
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        return true;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        this->IssueMessage(
          MessageType::FATAL_ERROR,
          cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0002));
        return true;
      case cmPolicies::NEW:
        break;
    }

    // The conflict is with a non-imported target.
    // Allow this if the user has requested support.
    cmake* cm = this->GetCMakeInstance();
    if (isCustom && existing->GetType() == cmStateEnums::UTILITY &&
        this != existing->GetMakefile() &&
        cm->GetState()->GetGlobalPropertyAsBool(
          "ALLOW_DUPLICATE_CUSTOM_TARGETS")) {
      return true;
    }

    // Produce an error that tells the user how to work around the
    // problem.
    std::ostringstream e;
    e << "cannot create target \"" << name
      << "\" because another target with the same name already exists.  "
      << "The existing target is ";
    switch (existing->GetType()) {
      case cmStateEnums::EXECUTABLE:
        e << "an executable ";
        break;
      case cmStateEnums::STATIC_LIBRARY:
        e << "a static library ";
        break;
      case cmStateEnums::SHARED_LIBRARY:
        e << "a shared library ";
        break;
      case cmStateEnums::MODULE_LIBRARY:
        e << "a module library ";
        break;
      case cmStateEnums::UTILITY:
        e << "a custom target ";
        break;
      case cmStateEnums::INTERFACE_LIBRARY:
        e << "an interface library ";
        break;
      default:
        break;
    }
    e << "created in source directory \""
      << existing->GetMakefile()->GetCurrentSourceDirectory() << "\".  "
      << "See documentation for policy CMP0002 for more details.";
    msg = e.str();
    return false;
  }
  return true;
}